

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O1

void __thiscall
btConeTwistConstraint::getInfo2NonVirtual
          (btConeTwistConstraint *this,btConstraintInfo2 *info,btTransform *transA,
          btTransform *transB,btMatrix3x3 *invInertiaWorldA,btMatrix3x3 *invInertiaWorldB)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  uint uVar8;
  btScalar *pbVar9;
  btScalar *pbVar10;
  btScalar *pbVar11;
  btScalar *pbVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  btScalar *pbVar17;
  int iVar18;
  long lVar19;
  btScalar bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  btVector3 a2;
  btVector3 a1;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  calcAngleInfo2(this,transA,transB,invInertiaWorldA,invInertiaWorldB);
  pbVar9 = info->m_J1linearAxis;
  *pbVar9 = 1.0;
  iVar7 = info->rowskip;
  lVar14 = (long)iVar7;
  pbVar9[lVar14 + 1] = 1.0;
  pbVar9[lVar14 * 2 + 2] = 1.0;
  fVar22 = (this->m_rbAFrame).m_origin.m_floats[0];
  fVar21 = (this->m_rbAFrame).m_origin.m_floats[1];
  fVar26 = (this->m_rbAFrame).m_origin.m_floats[2];
  fVar24 = fVar26 * (transA->m_basis).m_el[0].m_floats[2] +
           fVar22 * (transA->m_basis).m_el[0].m_floats[0] +
           (transA->m_basis).m_el[0].m_floats[1] * fVar21;
  fVar27 = fVar26 * (transA->m_basis).m_el[1].m_floats[2] +
           fVar22 * (transA->m_basis).m_el[1].m_floats[0] +
           (transA->m_basis).m_el[1].m_floats[1] * fVar21;
  fVar22 = fVar26 * (transA->m_basis).m_el[2].m_floats[2] +
           fVar22 * (transA->m_basis).m_el[2].m_floats[0] +
           fVar21 * (transA->m_basis).m_el[2].m_floats[1];
  local_40._4_4_ = fVar27;
  local_40._0_4_ = fVar24;
  local_40._8_4_ = fVar22;
  local_40._12_4_ = 0;
  pbVar9 = info->m_J1angularAxis;
  lVar15 = 0;
  *pbVar9 = 0.0;
  pbVar9[1] = fVar22;
  pbVar9[2] = -fVar27;
  pbVar9[3] = 0.0;
  pbVar9[lVar14] = -fVar22;
  pbVar9[lVar14 + 1] = 0.0;
  pbVar9[lVar14 + 2] = fVar24;
  pbVar9[lVar14 + 3] = 0.0;
  pbVar9[lVar14 * 2] = fVar27;
  pbVar9[lVar14 * 2 + 1] = -fVar24;
  (pbVar9 + lVar14 * 2 + 2)[0] = 0.0;
  (pbVar9 + lVar14 * 2 + 2)[1] = 0.0;
  pbVar10 = info->m_J2linearAxis;
  *pbVar10 = -1.0;
  pbVar10[lVar14 + 1] = -1.0;
  pbVar10[lVar14 * 2 + 2] = -1.0;
  fVar22 = (this->m_rbBFrame).m_origin.m_floats[0];
  fVar21 = (this->m_rbBFrame).m_origin.m_floats[1];
  fVar26 = (this->m_rbBFrame).m_origin.m_floats[2];
  fVar24 = fVar26 * (transB->m_basis).m_el[0].m_floats[2] +
           fVar22 * (transB->m_basis).m_el[0].m_floats[0] +
           (transB->m_basis).m_el[0].m_floats[1] * fVar21;
  fVar27 = fVar26 * (transB->m_basis).m_el[1].m_floats[2] +
           fVar22 * (transB->m_basis).m_el[1].m_floats[0] +
           (transB->m_basis).m_el[1].m_floats[1] * fVar21;
  fVar22 = fVar26 * (transB->m_basis).m_el[2].m_floats[2] +
           fVar22 * (transB->m_basis).m_el[2].m_floats[0] +
           fVar21 * (transB->m_basis).m_el[2].m_floats[1];
  local_50._4_4_ = fVar27;
  local_50._0_4_ = fVar24;
  local_50._8_4_ = fVar22;
  local_50._12_4_ = 0;
  pbVar10 = info->m_J2angularAxis;
  *pbVar10 = 0.0;
  pbVar10[1] = -fVar22;
  pbVar10[2] = fVar27;
  pbVar10[3] = 0.0;
  pbVar10[lVar14] = fVar22;
  pbVar10[lVar14 + 1] = 0.0;
  pbVar10[lVar14 + 2] = -fVar24;
  pbVar10[lVar14 + 3] = 0.0;
  pbVar10[lVar14 * 2] = -fVar27;
  pbVar10[lVar14 * 2 + 1] = fVar24;
  (pbVar10 + lVar14 * 2 + 2)[0] = 0.0;
  (pbVar10 + lVar14 * 2 + 2)[1] = 0.0;
  uVar8 = this->m_flags;
  pbVar17 = &this->m_linERP;
  if ((uVar8 & 2) == 0) {
    pbVar17 = &info->erp;
  }
  fVar22 = *pbVar17;
  fVar21 = info->fps;
  pbVar17 = info->m_constraintError;
  pbVar11 = info->m_lowerLimit;
  pbVar12 = info->m_upperLimit;
  lVar19 = 0;
  do {
    pbVar17[lVar19] =
         (((*(float *)(local_50 + lVar15) + *(float *)((long)(transB->m_origin).m_floats + lVar15))
          - *(float *)(local_40 + lVar15)) - *(float *)((long)(transA->m_origin).m_floats + lVar15))
         * fVar22 * fVar21;
    pbVar11[lVar19] = -3.4028235e+38;
    pbVar12[lVar19] = 3.4028235e+38;
    if ((uVar8 & 1) != 0) {
      info->cfm[lVar19] = this->m_linCFM;
    }
    lVar19 = lVar19 + lVar14;
    lVar15 = lVar15 + 4;
  } while (lVar15 != 0xc);
  iVar13 = iVar7 * 3;
  if (this->m_solveSwingLimit == true) {
    fVar22 = this->m_fixThresh;
    if ((fVar22 < this->m_swingSpan1 || fVar22 == this->m_swingSpan1) ||
       (fVar22 < this->m_swingSpan2 || fVar22 == this->m_swingSpan2)) {
      fVar22 = this->m_relaxationFactor;
      fVar21 = (this->m_swingAxis).m_floats[0] * fVar22 * fVar22;
      fVar26 = (this->m_swingAxis).m_floats[1] * fVar22 * fVar22;
      fVar22 = (this->m_swingAxis).m_floats[2] * fVar22 * fVar22;
      pbVar9[iVar13] = fVar21;
      pbVar9[(long)iVar13 + 1] = fVar26;
      pbVar9[(long)iVar13 + 2] = fVar22;
      pbVar10[iVar13] = -fVar21;
      pbVar10[(long)iVar13 + 1] = -fVar26;
      pbVar10[(long)iVar13 + 2] = -fVar22;
      info->m_constraintError[iVar13] = info->fps * this->m_biasFactor * this->m_swingCorrection;
      if ((uVar8 & 4) != 0) {
        info->cfm[iVar13] = this->m_angCFM;
      }
      info->m_lowerLimit[iVar13] = 0.0;
      fVar22 = 3.4028235e+38;
      if ((this->m_bMotorEnabled == true) && (0.0 <= this->m_maxMotorImpulse)) {
        fVar22 = this->m_maxMotorImpulse;
      }
      info->m_upperLimit[iVar13] = fVar22;
      iVar13 = iVar7 << 2;
    }
    else {
      fVar22 = (transA->m_basis).m_el[0].m_floats[0];
      fVar21 = (transA->m_basis).m_el[0].m_floats[1];
      fVar26 = (transA->m_basis).m_el[0].m_floats[2];
      fVar24 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[1];
      fVar27 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[1];
      fVar1 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[2];
      fVar23 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[1];
      fVar25 = fVar23 * fVar26 + fVar27 * fVar22 + fVar21 * fVar24;
      fVar2 = (transA->m_basis).m_el[1].m_floats[0];
      fVar3 = (transA->m_basis).m_el[1].m_floats[1];
      fVar4 = (transA->m_basis).m_el[1].m_floats[2];
      fVar29 = fVar23 * fVar4 + fVar27 * fVar2 + fVar24 * fVar3;
      fVar28 = (transA->m_basis).m_el[2].m_floats[0];
      fVar5 = (transA->m_basis).m_el[2].m_floats[1];
      fVar6 = (transA->m_basis).m_el[2].m_floats[2];
      fVar23 = fVar23 * fVar6 + fVar27 * fVar28 + fVar24 * fVar5;
      fVar24 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
      fVar27 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
      fVar28 = fVar6 * fVar27 + fVar28 * fVar1 + fVar5 * fVar24;
      iVar16 = iVar7 * 4;
      pbVar9[lVar14 * 3] = fVar25;
      pbVar9[(long)iVar13 + 1] = fVar29;
      pbVar9[(long)iVar13 + 2] = fVar23;
      fVar22 = fVar26 * fVar27 + fVar22 * fVar1 + fVar21 * fVar24;
      fVar21 = fVar4 * fVar27 + fVar2 * fVar1 + fVar3 * fVar24;
      *(ulong *)(pbVar9 + iVar16) = CONCAT44(fVar21,fVar22);
      iVar18 = iVar7 * 4 + 2;
      pbVar9[iVar18] = fVar28;
      pbVar10[lVar14 * 3] = -fVar25;
      pbVar10[(long)iVar13 + 1] = -fVar29;
      pbVar10[(long)iVar13 + 2] = -fVar23;
      *(ulong *)(pbVar10 + iVar16) = CONCAT44(fVar21,fVar22) ^ 0x8000000080000000;
      pbVar10[iVar18] = -fVar28;
      fVar26 = info->fps * this->m_relaxationFactor;
      pbVar17 = info->m_constraintError;
      pbVar17[lVar14 * 3] =
           (fVar23 * (this->m_swingAxis).m_floats[2] +
           fVar25 * (this->m_swingAxis).m_floats[0] + fVar29 * (this->m_swingAxis).m_floats[1]) *
           fVar26;
      pbVar17[iVar16] =
           (fVar28 * (this->m_swingAxis).m_floats[2] +
           fVar22 * (this->m_swingAxis).m_floats[0] + fVar21 * (this->m_swingAxis).m_floats[1]) *
           fVar26;
      pbVar17 = info->m_lowerLimit;
      pbVar17[lVar14 * 3] = -3.4028235e+38;
      pbVar11 = info->m_upperLimit;
      pbVar11[lVar14 * 3] = 3.4028235e+38;
      pbVar17[iVar16] = -3.4028235e+38;
      pbVar11[iVar16] = 3.4028235e+38;
      iVar13 = iVar7 * 5;
    }
  }
  if (this->m_solveTwistLimit != true) {
    return;
  }
  fVar22 = this->m_relaxationFactor;
  fVar21 = (this->m_twistAxis).m_floats[0] * fVar22 * fVar22;
  fVar26 = (this->m_twistAxis).m_floats[1] * fVar22 * fVar22;
  fVar22 = (this->m_twistAxis).m_floats[2] * fVar22 * fVar22;
  lVar14 = (long)iVar13;
  pbVar9[lVar14] = fVar21;
  pbVar9[lVar14 + 1] = fVar26;
  pbVar9[lVar14 + 2] = fVar22;
  pbVar10[lVar14] = -fVar21;
  pbVar10[lVar14 + 1] = -fVar26;
  pbVar10[lVar14 + 2] = -fVar22;
  info->m_constraintError[lVar14] = info->fps * this->m_biasFactor * this->m_twistCorrection;
  if ((uVar8 & 4) != 0) {
    info->cfm[lVar14] = this->m_angCFM;
  }
  bVar20 = 0.0;
  if (this->m_twistSpan <= 0.0) {
    info->m_lowerLimit[lVar14] = -3.4028235e+38;
  }
  else {
    if (this->m_twistCorrection <= 0.0) {
      info->m_lowerLimit[lVar14] = -3.4028235e+38;
      goto LAB_0018c46f;
    }
    info->m_lowerLimit[lVar14] = 0.0;
  }
  bVar20 = 3.4028235e+38;
LAB_0018c46f:
  info->m_upperLimit[lVar14] = bVar20;
  return;
}

Assistant:

void btConeTwistConstraint::getInfo2NonVirtual (btConstraintInfo2* info,const btTransform& transA,const btTransform& transB,const btMatrix3x3& invInertiaWorldA,const btMatrix3x3& invInertiaWorldB)
{
	calcAngleInfo2(transA,transB,invInertiaWorldA,invInertiaWorldB);
	
	btAssert(!m_useSolveConstraintObsolete);
    // set jacobian
    info->m_J1linearAxis[0] = 1;
    info->m_J1linearAxis[info->rowskip+1] = 1;
    info->m_J1linearAxis[2*info->rowskip+2] = 1;
	btVector3 a1 = transA.getBasis() * m_rbAFrame.getOrigin();
	{
		btVector3* angular0 = (btVector3*)(info->m_J1angularAxis);
		btVector3* angular1 = (btVector3*)(info->m_J1angularAxis+info->rowskip);
		btVector3* angular2 = (btVector3*)(info->m_J1angularAxis+2*info->rowskip);
		btVector3 a1neg = -a1;
		a1neg.getSkewSymmetricMatrix(angular0,angular1,angular2);
	}
    info->m_J2linearAxis[0] = -1;
    info->m_J2linearAxis[info->rowskip+1] = -1;
    info->m_J2linearAxis[2*info->rowskip+2] = -1;
	btVector3 a2 = transB.getBasis() * m_rbBFrame.getOrigin();
	{
		btVector3* angular0 = (btVector3*)(info->m_J2angularAxis);
		btVector3* angular1 = (btVector3*)(info->m_J2angularAxis+info->rowskip);
		btVector3* angular2 = (btVector3*)(info->m_J2angularAxis+2*info->rowskip);
		a2.getSkewSymmetricMatrix(angular0,angular1,angular2);
	}
    // set right hand side
	btScalar linERP = (m_flags & BT_CONETWIST_FLAGS_LIN_ERP) ? m_linERP : info->erp;
    btScalar k = info->fps * linERP;
    int j;
	for (j=0; j<3; j++)
    {
        info->m_constraintError[j*info->rowskip] = k * (a2[j] + transB.getOrigin()[j] - a1[j] - transA.getOrigin()[j]);
		info->m_lowerLimit[j*info->rowskip] = -SIMD_INFINITY;
		info->m_upperLimit[j*info->rowskip] = SIMD_INFINITY;
		if(m_flags & BT_CONETWIST_FLAGS_LIN_CFM)
		{
			info->cfm[j*info->rowskip] = m_linCFM;
		}
    }
	int row = 3;
    int srow = row * info->rowskip;
	btVector3 ax1;
	// angular limits
	if(m_solveSwingLimit)
	{
		btScalar *J1 = info->m_J1angularAxis;
		btScalar *J2 = info->m_J2angularAxis;
		if((m_swingSpan1 < m_fixThresh) && (m_swingSpan2 < m_fixThresh))
		{
			btTransform trA = transA*m_rbAFrame;
			btVector3 p = trA.getBasis().getColumn(1);
			btVector3 q = trA.getBasis().getColumn(2);
			int srow1 = srow + info->rowskip;
			J1[srow+0] = p[0];
			J1[srow+1] = p[1];
			J1[srow+2] = p[2];
			J1[srow1+0] = q[0];
			J1[srow1+1] = q[1];
			J1[srow1+2] = q[2];
			J2[srow+0] = -p[0];
			J2[srow+1] = -p[1];
			J2[srow+2] = -p[2];
			J2[srow1+0] = -q[0];
			J2[srow1+1] = -q[1];
			J2[srow1+2] = -q[2];
			btScalar fact = info->fps * m_relaxationFactor;
			info->m_constraintError[srow] =   fact * m_swingAxis.dot(p);
			info->m_constraintError[srow1] =  fact * m_swingAxis.dot(q);
			info->m_lowerLimit[srow] = -SIMD_INFINITY;
			info->m_upperLimit[srow] = SIMD_INFINITY;
			info->m_lowerLimit[srow1] = -SIMD_INFINITY;
			info->m_upperLimit[srow1] = SIMD_INFINITY;
			srow = srow1 + info->rowskip;
		}
		else
		{
			ax1 = m_swingAxis * m_relaxationFactor * m_relaxationFactor;
			J1[srow+0] = ax1[0];
			J1[srow+1] = ax1[1];
			J1[srow+2] = ax1[2];
			J2[srow+0] = -ax1[0];
			J2[srow+1] = -ax1[1];
			J2[srow+2] = -ax1[2];
			btScalar k = info->fps * m_biasFactor;

			info->m_constraintError[srow] = k * m_swingCorrection;
			if(m_flags & BT_CONETWIST_FLAGS_ANG_CFM)
			{
				info->cfm[srow] = m_angCFM;
			}
			// m_swingCorrection is always positive or 0
			info->m_lowerLimit[srow] = 0;
			info->m_upperLimit[srow] = (m_bMotorEnabled && m_maxMotorImpulse >= 0.0f) ? m_maxMotorImpulse : SIMD_INFINITY;
			srow += info->rowskip;
		}
	}
	if(m_solveTwistLimit)
	{
		ax1 = m_twistAxis * m_relaxationFactor * m_relaxationFactor;
		btScalar *J1 = info->m_J1angularAxis;
		btScalar *J2 = info->m_J2angularAxis;
		J1[srow+0] = ax1[0];
		J1[srow+1] = ax1[1];
		J1[srow+2] = ax1[2];
		J2[srow+0] = -ax1[0];
		J2[srow+1] = -ax1[1];
		J2[srow+2] = -ax1[2];
		btScalar k = info->fps * m_biasFactor;
		info->m_constraintError[srow] = k * m_twistCorrection;
		if(m_flags & BT_CONETWIST_FLAGS_ANG_CFM)
		{
			info->cfm[srow] = m_angCFM;
		}
		if(m_twistSpan > 0.0f)
		{

			if(m_twistCorrection > 0.0f)
			{
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			} 
			else
			{
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			} 
		}
		else
		{
			info->m_lowerLimit[srow] = -SIMD_INFINITY;
			info->m_upperLimit[srow] = SIMD_INFINITY;
		}
		srow += info->rowskip;
	}
}